

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O2

void __thiscall sparse_tree::sparse_tree(sparse_tree *this,string *structure,int n)

{
  pointer piVar1;
  pointer piVar2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  size_type __new_size;
  size_type __new_size_00;
  allocator_type local_d1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_d0;
  vector<int,_std::allocator<int>_> *local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  string *local_a8;
  string *local_a0;
  value_type_conflict local_94;
  undefined1 local_90 [16];
  pointer local_80;
  pointer piStack_78;
  pointer local_70;
  pointer piStack_68;
  pointer local_60;
  pointer piStack_58;
  string local_50;
  
  local_b0 = &this->FAI;
  local_b8 = &this->level;
  local_c8 = &this->logn;
  local_c0 = &this->up;
  memset(this,0,0xa8);
  (this->structure)._M_dataplus._M_p = (pointer)&(this->structure).field_2;
  (this->structure)._M_string_length = 0;
  (this->structure).field_2._M_local_buf[0] = '\0';
  local_d0 = &this->sparse_table;
  (this->sparse_table).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sparse_table).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sparse_table).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->n = (uint16_t)n;
  local_a8 = &this->structure;
  local_a0 = structure;
  std::__cxx11::string::_M_assign((string *)&this->structure);
  __new_size_00 = (size_type)(n + 1);
  local_90._0_8_ = (Node *)0x0;
  local_90._8_8_ = (pointer)0xfffffffeffffffff;
  local_80 = (pointer)0x0;
  piStack_78 = (pointer)0x0;
  local_70 = (pointer)0x0;
  piStack_68 = (pointer)0x0;
  local_60 = (pointer)0x0;
  piStack_58 = (pointer)0x0;
  std::vector<Node,_std::allocator<Node>_>::resize(&this->tree,__new_size_00,(value_type *)local_90)
  ;
  Node::~Node((Node *)local_90);
  local_90._0_8_ = (Node *)0x0;
  local_80 = (pointer)0x0;
  piStack_78 = (pointer)0x0;
  local_70 = (pointer)0x0;
  piStack_68 = (pointer)0x0;
  local_60 = (pointer)0x0;
  piStack_58 = (pointer)0x0;
  local_90._8_8_ = (pointer)0xfffffffe00000000;
  Node::operator=((this->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start,(Node *)local_90);
  Node::~Node((Node *)local_90);
  __new_size = (size_type)((n + 1) * 2);
  local_90._0_4_ = -1;
  std::vector<int,_std::allocator<int>_>::resize
            (local_b0,__new_size,(value_type_conflict *)local_90);
  local_90._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (local_b8,__new_size_00,(value_type_conflict *)local_90);
  std::vector<int,_std::allocator<int>_>::resize(local_c0,__new_size_00);
  std::vector<int,_std::allocator<int>_>::resize(local_c8,__new_size);
  std::__cxx11::string::string((string *)&local_50,(string *)local_a0);
  create_tree(this,n,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  preprocess(this);
  this_00 = local_d0;
  this->ptr = 0;
  dfs(this,0,-1,0);
  makeArr(this);
  piVar1 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (this->euler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->euler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_94 = -1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_90,0xe,&local_94,&local_d1);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(this_00,(long)piVar2 - (long)piVar1 >> 2,(value_type *)local_90);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_90);
  buildSparseTable(this,(int)((ulong)((long)(this->euler).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                     (long)(this->euler).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start) >> 2));
  return;
}

Assistant:

sparse_tree::sparse_tree(std::string structure,int n){
    this->n = n;
    this->structure = structure;
    tree.resize(n+1,Node());
    tree[0] = Node(0);
    FAI.resize(2*(n+1),-1);
    level.resize((n+1),-1);
    up.resize(n+1);
    logn.resize(2*(n+1));
    create_tree(n,structure);
    preprocess();
    ptr = 0;

    int cur = 1;
    dfs(0,-1,0);
    // depthArr.resize(euler.size());
    makeArr();
    level.clear();
    sparse_table.resize(euler.size(),std::vector<int>(maxSize,-1));
    buildSparseTable(euler.size());
}